

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

int mixed_queue_add(mixed_segment *new,mixed_segment *segment)

{
  int iVar1;
  uint local_460;
  mixed_segment_info_flags local_45c;
  uint local_458;
  uint32_t i_1;
  uint32_t outs;
  uint32_t i;
  uint32_t ins;
  mixed_segment_info info;
  queue_segment_data *data;
  mixed_segment *segment_local;
  mixed_segment *new_local;
  
  info.fields[0x1f]._24_8_ = segment->data;
  memset(&i,0,0x420);
  iVar1 = mixed_segment_start(new);
  if (iVar1 == 0) {
    new_local._4_4_ = 0;
  }
  else {
    iVar1 = vector_add(new,(vector *)info.fields[0x1f]._24_8_);
    if (iVar1 == 0) {
      new_local._4_4_ = 0;
    }
    else {
      mixed_segment_info((mixed_segment_info *)&i,new);
      if (*(mixed_segment_info_flags *)(info.fields[0x1f]._24_8_ + 0x28) < info.flags) {
        local_45c = *(mixed_segment_info_flags *)(info.fields[0x1f]._24_8_ + 0x28);
      }
      else {
        local_45c = info.flags;
      }
      for (i_1 = 0; i_1 < local_45c; i_1 = i_1 + 1) {
        mixed_segment_set_in
                  (0,i_1,*(void **)(*(long *)(info.fields[0x1f]._24_8_ + 0x20) + (ulong)i_1 * 8),new
                  );
      }
      if (*(uint *)(info.fields[0x1f]._24_8_ + 0x18) < info.min_inputs) {
        local_460 = *(uint *)(info.fields[0x1f]._24_8_ + 0x18);
      }
      else {
        local_460 = info.min_inputs;
      }
      for (local_458 = 0; local_458 < local_460; local_458 = local_458 + 1) {
        mixed_segment_set_out
                  (0,local_458,
                   *(void **)(*(long *)(info.fields[0x1f]._24_8_ + 0x10) + (ulong)local_458 * 8),new
                  );
      }
      new_local._4_4_ = 1;
    }
  }
  return new_local._4_4_;
}

Assistant:

MIXED_EXPORT int mixed_queue_add(struct mixed_segment *new, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  struct mixed_segment_info info = {0};

  if(!mixed_segment_start(new))
    return 0;
  
  if(!vector_add(new, (struct vector *)data))
    return 0;
  
  mixed_segment_info(&info, new);
  uint32_t ins = MIN(data->in_count, info.max_inputs);
  for(uint32_t i=0; i<ins; ++i){
    mixed_segment_set_in(MIXED_BUFFER, i, data->in[i], new);
  }
  uint32_t outs = MIN(data->out_count, info.outputs);
  for(uint32_t i=0; i<outs; ++i){
    mixed_segment_set_out(MIXED_BUFFER, i, data->out[i], new);
  }
  return 1;
}